

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<char_const*>
          (rpc_server *this,string *key,string *token,char *data)

{
  string_view msg;
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *this_00;
  char *in_RCX;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar3;
  error_code eVar4;
  shared_ptr<rest_rpc::rpc_service::connection> conn;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  range;
  unique_lock<std::mutex> lock;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shared_data;
  unique_lock<std::mutex> lock_1;
  key_type *in_stack_fffffffffffffe48;
  unique_lock<std::mutex> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  string local_158 [8];
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  connection *in_stack_fffffffffffffec0;
  string local_138 [48];
  int local_108;
  unique_lock<std::mutex> *local_100;
  string local_f8 [48];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_c8;
  string local_c0 [32];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  local_a0 [3];
  allocator local_69;
  string local_68 [52];
  uint local_34;
  char *local_20;
  
  local_20 = in_RCX;
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_fffffffffffffe50,(mutex_type *)in_stack_fffffffffffffe48);
  bVar1 = std::
          unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
          ::empty((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
                   *)0x2aea43);
  local_34 = (uint)bVar1;
  std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe50);
  if (local_34 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,local_20,&local_69);
    get_shared_data<char_const*>
              ((rpc_server *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (string *)in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::unique_lock<std::mutex>::unique_lock
              (in_stack_fffffffffffffe50,(mutex_type *)in_stack_fffffffffffffe48);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x230);
    std::operator+(__lhs,in_stack_fffffffffffffe70);
    pVar3 = std::
            unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
            ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
                           *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_a0[0] = pVar3;
    std::__cxx11::string::~string(local_c0);
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                        *)local_a0,
                       &local_a0[0].second.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                      );
    if (bVar1) {
      local_c8 = local_a0[0].first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                 ._M_cur;
      while( true ) {
        bVar1 = std::__detail::operator!=
                          (&local_c8,
                           &local_a0[0].second.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                          );
        if (!bVar1) break;
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
                      *)0x2aebd8);
        std::weak_ptr<rest_rpc::rpc_service::connection>::lock
                  ((weak_ptr<rest_rpc::rpc_service::connection> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar1 = std::operator==((shared_ptr<rest_rpc::rpc_service::connection> *)
                                in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (bVar1) {
LAB_002aec1f:
          local_34 = 4;
        }
        else {
          this_00 = std::
                    __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2aec0e);
          bVar1 = connection::has_closed(this_00);
          if (bVar1) goto LAB_002aec1f;
          std::
          __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2aecdd);
          std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pVar3.first.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                        );
          std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_fffffffffffffe50);
          connection::publish(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb0);
          std::__cxx11::string::~string(local_f8);
          local_34 = 0;
        }
        std::shared_ptr<rest_rpc::rpc_service::connection>::~shared_ptr
                  ((shared_ptr<rest_rpc::rpc_service::connection> *)0x2aed44);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
                      *)in_stack_fffffffffffffe50);
      }
    }
    else {
      eVar4 = asio::error::make_error_code(0);
      in_stack_fffffffffffffe50 = (unique_lock<std::mutex> *)eVar4._M_cat;
      iVar2 = eVar4._M_value;
      local_108 = iVar2;
      local_100 = in_stack_fffffffffffffe50;
      std::operator+(in_RDX,in_RSI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_fffffffffffffe58),(char *)in_stack_fffffffffffffe50);
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
      msg.size_ = (size_type)local_20;
      msg.data_ = (const_pointer)__lhs;
      error_callback((rpc_server *)
                     pVar3.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                     ,(error_code *)
                      pVar3.second.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                     ,msg);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_158);
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe50);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2aeec4);
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }